

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

abctime Saig_ManBmcTimeToStop(Saig_ParBmc_t *pPars,abctime nTimeToStopNG)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  long lVar4;
  timespec ts;
  timespec local_20;
  
  iVar1 = pPars->nTimeOutGap;
  if ((long)iVar1 == 0) {
    lVar4 = 0;
  }
  else {
    iVar2 = clock_gettime(3,&local_20);
    if (iVar2 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_20.tv_nsec / 1000 + local_20.tv_sec * 1000000;
    }
    lVar4 = lVar4 + (long)iVar1 * 1000000;
  }
  aVar3 = nTimeToStopNG;
  if (lVar4 < nTimeToStopNG) {
    aVar3 = lVar4;
  }
  if (lVar4 == 0) {
    aVar3 = nTimeToStopNG;
  }
  if (nTimeToStopNG == 0) {
    aVar3 = lVar4;
  }
  return aVar3;
}

Assistant:

abctime Saig_ManBmcTimeToStop( Saig_ParBmc_t * pPars, abctime nTimeToStopNG )
{
    abctime nTimeToStopGap = pPars->nTimeOutGap ? pPars->nTimeOutGap * CLOCKS_PER_SEC + Abc_Clock(): 0;
    abctime nTimeToStop = 0;
    if ( nTimeToStopNG && nTimeToStopGap )
        nTimeToStop = nTimeToStopNG < nTimeToStopGap ? nTimeToStopNG : nTimeToStopGap;
    else if ( nTimeToStopNG )
        nTimeToStop = nTimeToStopNG;
    else if ( nTimeToStopGap )
        nTimeToStop = nTimeToStopGap;
    return nTimeToStop;
}